

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::EmitClosureRangeChecks(IRBuilder *this)

{
  Instr **ppIVar1;
  Func *pFVar2;
  Type pJVar3;
  JitArenaAllocator *pJVar4;
  code *pcVar5;
  bool bVar6;
  OpndKind OVar7;
  byte bVar8;
  BOOL BVar9;
  uint uVar10;
  undefined4 *puVar11;
  Type *pTVar12;
  StackSym *pSVar13;
  Opnd *this_00;
  Instr *instr;
  RegOpnd *newDst;
  AddrOpnd *this_01;
  JITTimeFunctionBody *this_02;
  BVSparse<Memory::JitArenaAllocator> *this_03;
  Instr *pIVar14;
  ByteCodeUsesInstr *this_04;
  ulong uVar15;
  FrameDisplayCheckTable *pFVar16;
  Instr *pIVar17;
  undefined1 local_40 [8];
  Iterator __iter;
  
  if ((this->m_func->frameDisplayCheckTable != (FrameDisplayCheckTable *)0x0) &&
     (pFVar16 = this->m_func->frameDisplayCheckTable, pFVar16->tableSize != 0)) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar15 = 0;
    do {
      local_40 = (undefined1  [8])(pFVar16->table + uVar15);
      __iter.list = (SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount>
                     *)local_40;
      while( true ) {
        if (__iter.list ==
            (SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount> *)0x0)
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) goto LAB_004cfbea;
          *puVar11 = 0;
        }
        __iter.list = (SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount>
                       *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])__iter.list == local_40) break;
        pTVar12 = SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)local_40);
        pSVar13 = SymTable::FindStackSym(this->m_func->m_symTable,pTVar12->value);
        if ((pSVar13 == (StackSym *)0x0) || ((pSVar13->field_5).m_instrDef == (Instr *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,899,"(stackSym && stackSym->m_instrDef)",
                             "stackSym && stackSym->m_instrDef");
          if (!bVar6) goto LAB_004cfbea;
          *puVar11 = 0;
        }
        pIVar17 = (pSVar13->field_5).m_instrDef;
        pIVar14 = pIVar17->m_next;
        this_00 = IR::Instr::UnlinkDst(pIVar17);
        OVar7 = IR::Opnd::GetKind(this_00);
        if (OVar7 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar6) goto LAB_004cfbea;
          *puVar11 = 0;
        }
        instr = IR::Instr::New(FrameDisplayCheck,this_00,this->m_func);
        newDst = IR::RegOpnd::New(TyVar,this->m_func);
        IR::Instr::SetDst(pIVar17,&newDst->super_Opnd);
        if (instr->m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar6) goto LAB_004cfbea;
          *puVar11 = 0;
        }
        pFVar2 = instr->m_func;
        if ((newDst->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar6) goto LAB_004cfbea;
          *puVar11 = 0;
        }
        bVar8 = (newDst->super_Opnd).field_0xb;
        if ((bVar8 & 2) != 0) {
          newDst = (RegOpnd *)IR::Opnd::Copy(&newDst->super_Opnd,pFVar2);
          bVar8 = (newDst->super_Opnd).field_0xb;
        }
        (newDst->super_Opnd).field_0xb = bVar8 | 2;
        instr->m_src1 = &newDst->super_Opnd;
        this_01 = IR::AddrOpnd::New(pTVar12->element,AddrOpndKindDynamicMisc,this->m_func,true,
                                    (Var)0x0);
        if (instr->m_src2 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
          if (!bVar6) goto LAB_004cfbea;
          *puVar11 = 0;
        }
        pFVar2 = instr->m_func;
        if ((this_01->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar6) goto LAB_004cfbea;
          *puVar11 = 0;
        }
        bVar8 = (this_01->super_Opnd).field_0xb;
        if ((bVar8 & 2) != 0) {
          this_01 = (AddrOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar2);
          bVar8 = (this_01->super_Opnd).field_0xb;
        }
        (this_01->super_Opnd).field_0xb = bVar8 | 2;
        instr->m_src2 = &this_01->super_Opnd;
        IR::Instr::InsertBefore(pIVar14,instr);
      }
      uVar15 = uVar15 + 1;
      pFVar16 = this->m_func->frameDisplayCheckTable;
      __iter.list = (SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount>
                     *)0x0;
    } while (uVar15 < pFVar16->tableSize);
  }
  bVar6 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  if ((!bVar6) && (BVar9 = Func::HasTry(this->m_func), BVar9 != 0)) {
    this_02 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar10 = JITTimeFunctionBody::GetByteCodeInLoopCount(this_02);
    if (uVar10 != 0) {
      pSVar13 = this->m_func->m_localClosureSym;
      if ((pSVar13 == (StackSym *)0x0) || ((pSVar13->field_0x19 & 0x20) == 0)) {
        this_03 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      }
      else {
        this_03 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,this->m_func->m_alloc,0x3f1274);
        pJVar3 = this->m_func->m_alloc;
        this_03->head = (Type_conflict)0x0;
        this_03->lastFoundIndex = (Type_conflict)0x0;
        this_03->alloc = pJVar3;
        this_03->lastUsedNodePrevNextField = (Type)this_03;
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this_03,(this->m_func->m_localClosureSym->super_Sym).m_id);
      }
      pSVar13 = this->m_func->m_localFrameDisplaySym;
      if ((pSVar13 != (StackSym *)0x0) && ((pSVar13->field_0x19 & 0x20) != 0)) {
        if (this_03 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          this_03 = (BVSparse<Memory::JitArenaAllocator> *)
                    new<Memory::JitArenaAllocator>(0x20,this->m_func->m_alloc,0x3f1274);
          pJVar4 = this->m_func->m_alloc;
          this_03->head = (Type_conflict)0x0;
          this_03->lastFoundIndex = (Type_conflict)0x0;
          this_03->alloc = pJVar4;
          this_03->lastUsedNodePrevNextField = (Type)this_03;
        }
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this_03,(this->m_func->m_localFrameDisplaySym->super_Sym).m_id);
      }
      if ((this_03 != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
         (pIVar17 = this->m_func->m_tailInstr, pIVar17 != (Instr *)0x0)) {
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        pIVar14 = (Instr *)0x0;
        do {
          if ((pIVar14 != (Instr *)0x0) && (pIVar14->m_prev != pIVar17)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x3ab,
                               "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                               "Modifying instr list but not using EDITING iterator!");
            if (!bVar6) {
LAB_004cfbea:
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            *puVar11 = 0;
          }
          if (pIVar17->m_opcode == Ret) {
            this_04 = IR::ByteCodeUsesInstr::New(pIVar17);
            IR::ByteCodeUsesInstr::SetBV(this_04,this_03);
            IR::Instr::InsertBefore(pIVar17,&this_04->super_Instr);
            return;
          }
          ppIVar1 = &pIVar17->m_prev;
          pIVar14 = pIVar17;
          pIVar17 = *ppIVar1;
        } while (*ppIVar1 != (Instr *)0x0);
      }
    }
  }
  return;
}

Assistant:

void
IRBuilder::EmitClosureRangeChecks()
{
    if (m_func->frameDisplayCheckTable)
    {
        // Frame display checks. Again, chain to the instruction (LdEnv/LdSlot).
        FOREACH_HASHTABLE_ENTRY(FrameDisplayCheckRecord*, bucket, m_func->frameDisplayCheckTable)
        {
            StackSym *stackSym = m_func->m_symTable->FindStackSym(bucket.value);
            Assert(stackSym && stackSym->m_instrDef);

            IR::Instr *instrDef = stackSym->m_instrDef;
            IR::Instr *insertInstr = instrDef->m_next;
            IR::RegOpnd *dstOpnd = instrDef->UnlinkDst()->AsRegOpnd();
            IR::Instr *instr = IR::Instr::New(Js::OpCode::FrameDisplayCheck, dstOpnd, m_func);

            dstOpnd = IR::RegOpnd::New(TyVar, m_func);
            instrDef->SetDst(dstOpnd);
            instr->SetSrc1(dstOpnd);

            // Attach the two-dimensional check info.
            IR::AddrOpnd *recordOpnd = IR::AddrOpnd::New(bucket.element, IR::AddrOpndKindDynamicMisc, m_func, true);
            instr->SetSrc2(recordOpnd);

            insertInstr->InsertBefore(instr);
        }
        NEXT_HASHTABLE_ENTRY;
    }

    // If not a loop, but there are loops and trys, restore scope slot pointer and FD
    if (!m_func->IsLoopBody() && m_func->HasTry() && m_func->GetJITFunctionBody()->GetByteCodeInLoopCount() != 0)
    {
        BVSparse<JitArenaAllocator> * bv = nullptr;
        if (m_func->GetLocalClosureSym() && m_func->GetLocalClosureSym()->HasByteCodeRegSlot())
        {
            bv = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
            bv->Set(m_func->GetLocalClosureSym()->m_id);
        }
        if (m_func->GetLocalFrameDisplaySym() && m_func->GetLocalFrameDisplaySym()->HasByteCodeRegSlot())
        {
            if (!bv)
            {
                bv = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
            }
            bv->Set(m_func->GetLocalFrameDisplaySym()->m_id);
        }
        if (bv)
        {

            FOREACH_INSTR_IN_FUNC_BACKWARD(instr, m_func)
            {
                if (instr->m_opcode == Js::OpCode::Ret)
                {
                    IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(instr);
                    byteCodeUse->SetBV(bv);
                    instr->InsertBefore(byteCodeUse);
                    break;
                }
            }
            NEXT_INSTR_IN_FUNC_BACKWARD;
        }
    }
}